

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void ttdell(int row,int bot,int nchunk)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  
  if (bot - row == 0) {
    ttmove(row,0);
    tteeol();
    return;
  }
  if (*(long *)(*(long *)(_cur_term + 0x20) + 0x18) == 0) {
    if (insdel == 0) {
      panic("ttdell: Can\'t insert/delete line");
    }
    ttmove(row,0);
    iVar4 = nrow - ttrow;
    lVar1 = *(long *)(*(long *)(_cur_term + 0x20) + 0x350);
    if (lVar1 == 0) {
      iVar3 = nchunk;
      if (0 < nchunk) {
        do {
          tputs(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0xb0),iVar4,ttputc);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    else {
      uVar2 = tgoto(lVar1,0,nchunk);
      tputs(uVar2,iVar4,ttputc);
    }
    ttmove((bot - nchunk) + 1,0);
    iVar4 = nrow - ttrow;
    lVar1 = *(long *)(*(long *)(_cur_term + 0x20) + 0x370);
    if (lVar1 == 0) {
      if (0 < nchunk) {
        do {
          tputs(*(undefined8 *)(*(long *)(_cur_term + 0x20) + 0x1a8),iVar4,ttputc);
          nchunk = nchunk + -1;
        } while (nchunk != 0);
      }
    }
    else {
      uVar2 = tgoto(lVar1,0,nchunk);
      tputs(uVar2,iVar4,ttputc);
    }
    ttrow = 1000;
    ttcol = 1000;
    return;
  }
  ttwindow(row,bot);
  ttmove(bot,0);
  if (nchunk != 0) {
    do {
      tputs(scroll_fwd,bot - row,ttputc);
      nchunk = nchunk + -1;
    } while (nchunk != 0);
  }
  ttnowindow();
  return;
}

Assistant:

void
ttdell(int row, int bot, int nchunk)
{
	int	i, nl;

	/* One line special cases */
	if (row == bot) {
		ttmove(row, 0);
		tteeol();
		return;
	}
	/* scrolling region */
	if (change_scroll_region) {
		nl = bot - row;
		ttwindow(row, bot);
		ttmove(bot, 0);
		while (nchunk--)
			putpad(scroll_fwd, nl);
		ttnowindow();
	/* else use insert/delete line */
	} else if (insdel) {
		ttmove(row, 0);
		nl = nrow - ttrow;
		if (parm_delete_line)
			putpad(tgoto(parm_delete_line, 0, nchunk), nl);
		else
			/* For all lines in the chunk */
			for (i = 0; i < nchunk; i++)
				putpad(delete_line, nl);
		ttmove(1 + bot - nchunk, 0);

		/* ttmove() changes ttrow */
		nl = nrow - ttrow;

		if (parm_insert_line)
			putpad(tgoto(parm_insert_line, 0, nchunk), nl);
		else
			/* For all lines in the chunk */
			for (i = 0; i < nchunk; i++)
				putpad(insert_line, nl);
		ttrow = HUGE;
		ttcol = HUGE;
	} else
		panic("ttdell: Can't insert/delete line");
}